

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::ResolveAndPlan
          (PhysicalPlanGenerator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  undefined1 __p [8];
  QueryProfiler *this_00;
  type op_00;
  pointer this_01;
  pointer pPVar1;
  PhysicalOperator *pPVar2;
  undefined1 local_48 [8];
  ColumnBindingResolver resolver;
  
  this_00 = QueryProfiler::Get(this->context);
  QueryProfiler::StartPhase(this_00,PHYSICAL_PLANNER_COLUMN_BINDING);
  ColumnBindingResolver::ColumnBindingResolver(&resolver,false);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(op);
  ColumnBindingResolver::VisitOperator(&resolver,op_00);
  QueryProfiler::EndPhase(this_00);
  QueryProfiler::StartPhase(this_00,PHYSICAL_PLANNER_RESOLVE_TYPES);
  this_01 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(op);
  LogicalOperator::ResolveOperatorTypes(this_01);
  QueryProfiler::EndPhase(this_00);
  QueryProfiler::StartPhase(this_00,PHYSICAL_PLANNER_CREATE_PLAN);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::operator*
            (op);
  PlanInternal((PhysicalPlanGenerator *)local_48,(LogicalOperator *)this);
  __p = local_48;
  local_48 = (undefined1  [8])0x0;
  ::std::__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::reset
            ((__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
             &this->physical_plan,(pointer)__p);
  ::std::unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::~unique_ptr
            ((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
             local_48);
  QueryProfiler::EndPhase(this_00);
  pPVar1 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&this->physical_plan);
  pPVar2 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&pPVar1->root);
  ColumnBindingResolver::~ColumnBindingResolver(&resolver);
  return pPVar2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::ResolveAndPlan(unique_ptr<LogicalOperator> op) {
	auto &profiler = QueryProfiler::Get(context);

	// Resolve the column references.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER_COLUMN_BINDING);
	ColumnBindingResolver resolver;
	resolver.VisitOperator(*op);
	profiler.EndPhase();

	// Resolve the types of each operator.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER_RESOLVE_TYPES);
	op->ResolveOperatorTypes();
	profiler.EndPhase();

	// Create the main physical plan.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER_CREATE_PLAN);
	physical_plan = PlanInternal(*op);
	profiler.EndPhase();

	// Return a reference to the root of this plan.
	return physical_plan->Root();
}